

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::renderShadowMap(SceneRender *this,Uniforms *_uniforms)

{
  Light *pLVar1;
  Model *this_00;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  Tracker *pTVar5;
  pointer ppVar6;
  mat4 *pmVar7;
  Vbo *pVVar8;
  mat4 *pmVar9;
  vec3 *pvVar10;
  vec3 *v2;
  pointer ppVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar12;
  vec<3,_float,_(glm::qualifier)0> vVar13;
  allocator local_479;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  vec3 local_438;
  vec3 local_428;
  allocator local_419;
  string local_418;
  mat<4,_4,_float,_(glm::qualifier)0> local_3f4;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  mat<4,_4,_float,_(glm::qualifier)0> local_33c;
  allocator local_2f9;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator local_2b1;
  string local_2b0;
  _Self local_290;
  _Self local_288;
  iterator mit;
  string local_278;
  vec3 local_258;
  vec3 local_248;
  allocator local_239;
  string local_238;
  mat<4,_4,_float,_(glm::qualifier)0> local_214;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  mat<4,_4,_float,_(glm::qualifier)0> local_15c;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  undefined8 uStack_a8;
  mat4 m;
  _Self local_60;
  iterator lit;
  Shader *shadowShader;
  allocator local_39;
  string local_38;
  Uniforms *local_18;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  if ((this->m_shadows & 1U) != 0) {
    local_18 = _uniforms;
    _uniforms_local = (Uniforms *)this;
    bVar3 = Tracker::isRunning(&_uniforms->tracker);
    if (bVar3) {
      pTVar5 = &local_18->tracker;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"render:scene:shadowmap",&local_39);
      Tracker::begin(pTVar5,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    lit._M_node = (_Base_ptr)0x0;
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
         ::begin(&(local_18->super_Scene).lights);
    while( true ) {
      m.value[3]._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
           ::end(&(local_18->super_Scene).lights);
      bVar3 = std::operator!=(&local_60,(_Self *)&m.value[3].field_2);
      if (!bVar3) break;
      if ((((this->dynamicShadows & 1U) != 0) ||
          (ppVar6 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                    ::operator->(&local_60), ((ppVar6->second->super_Node).bChange & 1U) != 0)) ||
         (bVar3 = haveChange(this), bVar3)) {
        pmVar7 = vera::Node::getTransformMatrix(&this->m_origin);
        uStack_a8._0_4_ = pmVar7->value[0].field_0;
        uStack_a8._4_4_ = pmVar7->value[0].field_1;
        m.value[0].field_0 =
             *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
              &pmVar7->value[0].field_2;
        m.value[0].field_1 =
             *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
              &pmVar7->value[0].field_3;
        m.value[0].field_2 =
             *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
              &pmVar7->value[1].field_0;
        m.value[0].field_3 =
             *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
              &pmVar7->value[1].field_1;
        m.value[1].field_0 =
             *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
              &pmVar7->value[1].field_2;
        m.value[1].field_1 =
             *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
              &pmVar7->value[1].field_3;
        m.value[1].field_2 =
             *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
              &pmVar7->value[2].field_0;
        m.value[1].field_3 =
             *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
              &pmVar7->value[2].field_1;
        m.value[2].field_0 =
             *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
              &pmVar7->value[2].field_2;
        m.value[2].field_1 =
             *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
              &pmVar7->value[2].field_3;
        m.value[2].field_2 =
             *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
              &pmVar7->value[3].field_0;
        m.value[2].field_3 =
             *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
              &pmVar7->value[3].field_1;
        m.value[3].field_0 =
             *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
              &pmVar7->value[3].field_2;
        m.value[3].field_1 =
             *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
              &pmVar7->value[3].field_3;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_60);
        vera::Light::bindShadowMap(ppVar6->second);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,"shadow",&local_c9);
        lit._M_node = (_Base_ptr)vera::Model::getBufferShader(&this->m_floor,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        pVVar8 = vera::Model::getVbo(&this->m_floor);
        if ((pVVar8 != (Vbo *)0x0) && (lit._M_node != (_Base_ptr)0x0)) {
          bVar3 = Tracker::isRunning(&local_18->tracker);
          if (bVar3) {
            pTVar5 = &local_18->tracker;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_f0,"render:scene:shadowmap:floor",&local_f1);
            Tracker::begin(pTVar5,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          }
          vera::Shader::use((Shader *)lit._M_node);
          (*(local_18->super_Scene)._vptr_Scene[0x3e])(local_18,lit._M_node,0);
          iVar2 = lit;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_118,"u_modelViewProjectionMatrix",&local_119);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                   ::operator->(&local_60);
          pLVar1 = ppVar6->second;
          pmVar7 = vera::Node::getTransformMatrix(&this->m_origin);
          pmVar9 = vera::Node::getTransformMatrix(&(this->m_floor).super_Node);
          glm::operator*(&local_15c,pmVar7,pmVar9);
          pmVar7 = vera::Light::getMVPMatrix(pLVar1,&local_15c,this->m_area);
          vera::Shader::setUniform((Shader *)iVar2._M_node,&local_118,pmVar7,false);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
          iVar2 = lit;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_180,"u_projectionMatrix",&local_181);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                   ::operator->(&local_60);
          pmVar7 = vera::Light::getProjectionMatrix(ppVar6->second);
          vera::Shader::setUniform((Shader *)iVar2._M_node,&local_180,pmVar7,false);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          iVar2 = lit;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1a8,"u_viewMatrix",&local_1a9);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                   ::operator->(&local_60);
          pmVar7 = vera::Light::getViewMatrix(ppVar6->second);
          vera::Shader::setUniform((Shader *)iVar2._M_node,&local_1a8,pmVar7,false);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          iVar2 = lit;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1d0,"u_modelMatrix",&local_1d1);
          pmVar7 = vera::Node::getTransformMatrix(&this->m_origin);
          pmVar9 = vera::Node::getTransformMatrix(&(this->m_floor).super_Node);
          glm::operator*(&local_214,pmVar7,pmVar9);
          vera::Shader::setUniform((Shader *)iVar2._M_node,&local_1d0,&local_214,false);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          iVar2 = lit;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_238,"u_model",&local_239);
          pvVar10 = vera::Node::getPosition(&this->m_origin);
          v2 = vera::Node::getPosition(&(this->m_floor).super_Node);
          vVar13 = glm::operator+(pvVar10,v2);
          local_258.field_2 = vVar13.field_2;
          local_258._0_8_ = vVar13._0_8_;
          local_248._0_8_ = local_258._0_8_;
          local_248.field_2 = local_258.field_2;
          vera::Shader::setUniform((Shader *)iVar2._M_node,&local_238,&local_248);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator((allocator<char> *)&local_239);
          vera::Model::render(&this->m_floor,(Shader *)lit._M_node);
          bVar3 = Tracker::isRunning(&local_18->tracker);
          if (bVar3) {
            pTVar5 = &local_18->tracker;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_278,"render:scene:shadowmap:floor",
                       (allocator *)((long)&mit._M_node + 7));
            Tracker::end(pTVar5,&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::allocator<char>::~allocator((allocator<char> *)((long)&mit._M_node + 7));
          }
        }
        local_288._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
             ::begin(&(local_18->super_Scene).models);
        while( true ) {
          local_290._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
               ::end(&(local_18->super_Scene).models);
          bVar3 = std::operator!=(&local_288,&local_290);
          if (!bVar3) break;
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                    ::operator->(&local_288);
          this_00 = ppVar11->second;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2b0,"shadow",&local_2b1);
          lit._M_node = (_Base_ptr)vera::Model::getBufferShader(this_00,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
          if (lit._M_node != (_Base_ptr)0x0) {
            bVar3 = Tracker::isRunning(&local_18->tracker);
            if (bVar3) {
              pTVar5 = &local_18->tracker;
              ppVar11 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                        ::operator->(&local_288);
              psVar12 = vera::Model::getName_abi_cxx11_(ppVar11->second);
              std::operator+(&local_2d8,"render:scene:shadowmap:",psVar12);
              Tracker::begin(pTVar5,&local_2d8);
              std::__cxx11::string::~string((string *)&local_2d8);
            }
            vera::Shader::use((Shader *)lit._M_node);
            (*(local_18->super_Scene)._vptr_Scene[0x3e])(local_18,lit._M_node,0);
            iVar2 = lit;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_2f8,"u_modelViewProjectionMatrix",&local_2f9);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                     ::operator->(&local_60);
            pLVar1 = ppVar6->second;
            pmVar7 = vera::Node::getTransformMatrix(&this->m_origin);
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                      ::operator->(&local_288);
            iVar4 = (*(ppVar11->second->super_Node)._vptr_Node[0x20])();
            glm::operator*(&local_33c,pmVar7,
                           (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar4));
            pmVar7 = vera::Light::getMVPMatrix(pLVar1,&local_33c,this->m_area);
            vera::Shader::setUniform((Shader *)iVar2._M_node,&local_2f8,pmVar7,false);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
            iVar2 = lit;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_360,"u_projectionMatrix",&local_361);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                     ::operator->(&local_60);
            pmVar7 = vera::Light::getProjectionMatrix(ppVar6->second);
            vera::Shader::setUniform((Shader *)iVar2._M_node,&local_360,pmVar7,false);
            std::__cxx11::string::~string((string *)&local_360);
            std::allocator<char>::~allocator((allocator<char> *)&local_361);
            iVar2 = lit;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_388,"u_viewMatrix",&local_389);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                     ::operator->(&local_60);
            pmVar7 = vera::Light::getViewMatrix(ppVar6->second);
            vera::Shader::setUniform((Shader *)iVar2._M_node,&local_388,pmVar7,false);
            std::__cxx11::string::~string((string *)&local_388);
            std::allocator<char>::~allocator((allocator<char> *)&local_389);
            iVar2 = lit;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3b0,"u_modelMatrix",&local_3b1);
            pmVar7 = vera::Node::getTransformMatrix(&this->m_origin);
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                      ::operator->(&local_288);
            iVar4 = (*(ppVar11->second->super_Node)._vptr_Node[0x20])();
            glm::operator*(&local_3f4,pmVar7,
                           (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var_00,iVar4));
            vera::Shader::setUniform((Shader *)iVar2._M_node,&local_3b0,&local_3f4,false);
            std::__cxx11::string::~string((string *)&local_3b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
            iVar2 = lit;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_418,"u_model",&local_419);
            pvVar10 = vera::Node::getPosition(&this->m_origin);
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                      ::operator->(&local_288);
            iVar4 = (*(ppVar11->second->super_Node)._vptr_Node[0x13])();
            vVar13 = glm::operator+(pvVar10,(vec<3,_float,_(glm::qualifier)0> *)
                                            CONCAT44(extraout_var_01,iVar4));
            local_438.field_2 = vVar13.field_2;
            local_438._0_8_ = vVar13._0_8_;
            local_428._0_8_ = local_438._0_8_;
            local_428.field_2 = local_438.field_2;
            vera::Shader::setUniform((Shader *)iVar2._M_node,&local_418,&local_428);
            std::__cxx11::string::~string((string *)&local_418);
            std::allocator<char>::~allocator((allocator<char> *)&local_419);
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                      ::operator->(&local_288);
            vera::Model::render(ppVar11->second,(Shader *)lit._M_node);
            bVar3 = Tracker::isRunning(&local_18->tracker);
            if (bVar3) {
              pTVar5 = &local_18->tracker;
              ppVar11 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                        ::operator->(&local_288);
              psVar12 = vera::Model::getName_abi_cxx11_(ppVar11->second);
              std::operator+(&local_458,"render:scene:shadowmap:",psVar12);
              Tracker::end(pTVar5,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
            }
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
          ::operator++(&local_288);
        }
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_60);
        vera::Light::unbindShadowMap(ppVar6->second);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
      ::operator++(&local_60);
    }
    bVar3 = Tracker::isRunning(&local_18->tracker);
    if (bVar3) {
      pTVar5 = &local_18->tracker;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_478,"shadowmap",&local_479);
      Tracker::end(pTVar5,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
  }
  return;
}

Assistant:

void SceneRender::renderShadowMap(Uniforms& _uniforms) {
    if (!m_shadows)
        return;

    TRACK_BEGIN("render:scene:shadowmap")
    vera::Shader* shadowShader = nullptr;
    for (vera::LightsMap::iterator lit = _uniforms.lights.begin(); lit != _uniforms.lights.end(); ++lit) {
        if (dynamicShadows ||  lit->second->bChange || haveChange() ) {
            // Temporally move the MVP matrix from the view of the light 
            glm::mat4 m = m_origin.getTransformMatrix();
            // glm::mat4 p = lit->second->getProjectionMatrix();
            // glm::mat4 v = lit->second->getViewMatrix();
            
            lit->second->bindShadowMap();

            shadowShader = m_floor.getBufferShader("shadow");
            if (m_floor.getVbo() && shadowShader != nullptr) {
                TRACK_BEGIN("render:scene:shadowmap:floor")
                shadowShader->use();
                _uniforms.feedTo( shadowShader, false );
                shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * m_floor.getTransformMatrix(), m_area ) );
                shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                shadowShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                m_floor.render(shadowShader);
                TRACK_END("render:scene:shadowmap:floor")
            }

            for (vera::ModelsMap::iterator mit = _uniforms.models.begin(); mit != _uniforms.models.end(); ++mit) {
                shadowShader = mit->second->getBufferShader("shadow");
                if (shadowShader != nullptr) {
                    TRACK_BEGIN("render:scene:shadowmap:" + mit->second->getName())

                    // bind the shader
                    shadowShader->use();

                    // Update Uniforms and textures variables to the shader
                    _uniforms.feedTo( shadowShader, false );

                    // Pass special uniforms
                    shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * mit->second->getTransformMatrix(), m_area ) );
                    shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                    shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                    shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * mit->second->getTransformMatrix() );
                    shadowShader->setUniform( "u_model", m_origin.getPosition() + mit->second->getPosition() );
                    mit->second->render(shadowShader);

                    TRACK_END("render:scene:shadowmap:" + mit->second->getName())
                }
            }

            lit->second->unbindShadowMap();
        }
    }
    TRACK_END("shadowmap")
}